

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

int If_ManCountSpecialPos(If_Man_t *p)

{
  int iVar1;
  If_Obj_t *pIVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = p->pPars->nLatchesCoBox; iVar1 = If_ManCoNum(p),
      local_1c < iVar1 - p->pPars->nLatchesCo; local_1c = local_1c + 1) {
    pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    pIVar2 = If_ObjFanin0(pIVar2);
    *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffeff;
  }
  for (local_1c = p->pPars->nLatchesCoBox; iVar1 = If_ManCoNum(p),
      local_1c < iVar1 - p->pPars->nLatchesCo; local_1c = local_1c + 1) {
    pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    iVar1 = If_ObjFaninC0(pIVar2);
    if (iVar1 == 0) {
      pIVar2 = If_ObjFanin0(pIVar2);
      *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffeff | 0x100;
    }
  }
  for (local_1c = p->pPars->nLatchesCoBox; iVar1 = If_ManCoNum(p),
      local_1c < iVar1 - p->pPars->nLatchesCo; local_1c = local_1c + 1) {
    pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    iVar1 = If_ObjFaninC0(pIVar2);
    if (iVar1 != 0) {
      pIVar2 = If_ObjFanin0(pIVar2);
      local_20 = (*(uint *)pIVar2 >> 8 & 1) + local_20;
    }
  }
  for (local_1c = p->pPars->nLatchesCoBox; iVar1 = If_ManCoNum(p),
      local_1c < iVar1 - p->pPars->nLatchesCo; local_1c = local_1c + 1) {
    pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    pIVar2 = If_ObjFanin0(pIVar2);
    *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffeff;
  }
  return local_20;
}

Assistant:

int If_ManCountSpecialPos( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( !If_ObjFaninC0(pObj) )
            If_ObjFanin0(pObj)->fMark = 1;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( If_ObjFaninC0(pObj) )
            Counter += If_ObjFanin0(pObj)->fMark;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    return Counter;
}